

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O3

void __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  long lVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  char *pcVar4;
  iterator iVar5;
  Mutability *pMVar6;
  iterator iVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  __hash_code __code;
  pointer pFVar11;
  _Hash_node_base *p_Var12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pFVar16;
  __node_base _Var17;
  ulong uVar18;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  undefined1 local_98 [8];
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  oldFieldNames;
  FieldList copy;
  HeapType oldStructType_local;
  uint uStack_38;
  value_type newIndex;
  __alloc_node_gen_t __alloc_node_gen;
  
  copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)oldStructType.id;
  iVar5 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(*(long *)((long)this + 0x68) + 0x90),
                 (key_type *)
                 &copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  lVar1 = *(long *)((long)this + 0x68);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    lVar2 = *(long *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                            ._M_cur + 0x10);
    uVar14 = (*(long *)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                              ._M_cur + 0x20) - lVar2) * 8 +
             (ulong)*(uint *)((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                    ._M_cur + 0x28);
    if (uVar14 != 0) {
      pMVar6 = &((struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start)->mutable_;
      uVar15 = 0;
      do {
        if ((*(ulong *)(lVar2 + (uVar15 >> 6 & 0x3ffffff) * 8) >> (uVar15 & 0x3f) & 1) != 0) {
          *pMVar6 = Immutable;
        }
        uVar15 = uVar15 + 1;
        pMVar6 = pMVar6 + 4;
      } while ((uVar15 & 0xffffffff) < uVar14);
    }
  }
  iVar7 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(lVar1 + 200),
                 (key_type *)
                 &copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
               &oldFieldNames._M_h._M_single_bucket,&struct_->fields);
    pFVar11 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pFVar16 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar14 = 0;
    if (pFVar16 == pFVar11) {
      uVar15 = 0;
    }
    else {
      uVar13 = 1;
      uVar18 = 0;
      do {
        uVar15 = (ulong)*(uint *)(*(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                                  ._M_cur + 0x10) + uVar18 * 4);
        if (uVar15 == 0xffffffff) {
          uVar14 = (ulong)((int)uVar14 + 1);
        }
        else {
          p_Var12 = (oldFieldNames._M_h._M_single_bucket + uVar18 * 2)[1]._M_nxt;
          pFVar11[uVar15].type.id =
               (uintptr_t)oldFieldNames._M_h._M_single_bucket[uVar18 * 2]._M_nxt;
          *(_Hash_node_base **)&pFVar11[uVar15].packedType = p_Var12;
          pFVar11 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pFVar16 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar18 = (ulong)uVar13;
        uVar15 = (long)pFVar16 - (long)pFVar11 >> 4;
        uVar13 = uVar13 + 1;
      } while (uVar18 < uVar15);
    }
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::resize(&struct_->fields,uVar15 - uVar14)
    ;
    iVar8 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(*(long *)((long)this + 8) + 400),
                   (key_type *)
                   &copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    if (iVar8.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
        _M_cur != (__node_type *)0x0) {
      __ht = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)((long)iVar8.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                       ._M_cur + 0x20);
      _uStack_38 = (__hashtable_alloc *)local_98;
      local_98 = (undefined1  [8])0x0;
      oldFieldNames._M_h._M_buckets =
           *(__buckets_ptr *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x28);
      oldFieldNames._M_h._M_bucket_count = 0;
      oldFieldNames._M_h._M_before_begin._M_nxt =
           *(_Hash_node_base **)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x38);
      oldFieldNames._M_h._M_element_count =
           *(size_type *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x40);
      oldFieldNames._M_h._M_rehash_policy._0_8_ =
           *(undefined8 *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                   ._M_cur + 0x48);
      oldFieldNames._M_h._M_rehash_policy._M_next_resize = 0;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)_uStack_38,__ht,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
                  *)&stack0xffffffffffffffc8);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(__ht);
      _uStack_38 = _uStack_38 & 0xffffffff00000000;
      if (oldFieldNames._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        p_Var12 = (_Hash_node_base *)0x0;
        _Var17 = oldFieldNames._M_h._M_before_begin;
        do {
          oldStructType_local.id._4_4_ =
               *(int *)(*(long *)((long)iVar7.
                                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                        ._M_cur + 0x10) + (long)p_Var12 * 4);
          if (oldStructType_local.id._4_4_ != -1) {
            if (*(__buckets_ptr)
                 ((long)local_98 + ((ulong)p_Var12 % (ulong)oldFieldNames._M_h._M_buckets) * 8) !=
                (__node_base_ptr)0x0) {
              p_Var3 = (*(__buckets_ptr)
                         ((long)local_98 +
                         ((ulong)p_Var12 % (ulong)oldFieldNames._M_h._M_buckets) * 8))->_M_nxt;
              uVar13 = *(uint *)&p_Var3[1]._M_nxt;
              while ((uint)p_Var12 != uVar13) {
                p_Var3 = p_Var3->_M_nxt;
                if ((p_Var3 == (_Hash_node_base *)0x0) ||
                   (uVar13 = *(uint *)&p_Var3[1]._M_nxt,
                   (ulong)uVar13 % (ulong)oldFieldNames._M_h._M_buckets !=
                   (ulong)p_Var12 % (ulong)oldFieldNames._M_h._M_buckets)) goto LAB_00893723;
              }
              pmVar9 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_98,&stack0xffffffffffffffc8);
              if ((pmVar9->super_IString).str._M_str == (char *)0x0) {
                __assert_fail("oldFieldNames[i].is()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalTypeOptimization.cpp"
                              ,0x1b4,
                              "virtual void wasm::(anonymous namespace)::GlobalTypeOptimization::updateTypes(Module &)::TypeRewriter::modifyStruct(HeapType, Struct &)"
                             );
              }
              pmVar9 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_98,&stack0xffffffffffffffc8);
              pmVar10 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)__ht,(key_type *)((long)&oldStructType_local.id + 4));
              pcVar4 = (pmVar9->super_IString).str._M_str;
              (pmVar10->super_IString).str._M_len = (pmVar9->super_IString).str._M_len;
              (pmVar10->super_IString).str._M_str = pcVar4;
              p_Var12 = (_Hash_node_base *)((ulong)_uStack_38 & 0xffffffff);
              _Var17 = oldFieldNames._M_h._M_before_begin;
            }
          }
LAB_00893723:
          uVar13 = (int)p_Var12 + 1;
          p_Var12 = (_Hash_node_base *)(ulong)uVar13;
          uStack_38 = uVar13;
        } while (p_Var12 < _Var17._M_nxt);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_98);
    }
    if (oldFieldNames._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      operator_delete(oldFieldNames._M_h._M_single_bucket,
                      (long)copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)oldFieldNames._M_h._M_single_bucket);
    }
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        auto& newFields = struct_.fields;

        // Adjust immutability.
        auto immIter = parent.canBecomeImmutable.find(oldStructType);
        if (immIter != parent.canBecomeImmutable.end()) {
          auto& immutableVec = immIter->second;
          for (Index i = 0; i < immutableVec.size(); i++) {
            if (immutableVec[i]) {
              newFields[i].mutable_ = Immutable;
            }
          }
        }

        // Remove/reorder fields where we can.
        auto remIter = parent.indexesAfterRemovals.find(oldStructType);
        if (remIter != parent.indexesAfterRemovals.end()) {
          auto& indexesAfterRemoval = remIter->second;
          Index removed = 0;
          auto copy = newFields;
          for (Index i = 0; i < newFields.size(); i++) {
            auto newIndex = indexesAfterRemoval[i];
            if (newIndex != RemovedField) {
              newFields[newIndex] = copy[i];
            } else {
              removed++;
            }
          }
          newFields.resize(newFields.size() - removed);

          // Update field names as well. The Type Rewriter cannot do this for
          // us, as it does not know which old fields map to which new ones (it
          // just keeps the names in sequence).
          auto iter = wasm.typeNames.find(oldStructType);
          if (iter != wasm.typeNames.end()) {
            auto& nameInfo = iter->second;

            // Make a copy of the old ones to base ourselves off of as we do so.
            auto oldFieldNames = nameInfo.fieldNames;

            // Clear the old names and write the new ones.
            nameInfo.fieldNames.clear();
            for (Index i = 0; i < oldFieldNames.size(); i++) {
              auto newIndex = indexesAfterRemoval[i];
              if (newIndex != RemovedField && oldFieldNames.count(i)) {
                assert(oldFieldNames[i].is());
                nameInfo.fieldNames[newIndex] = oldFieldNames[i];
              }
            }
          }
        }
      }